

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvDisc_dns.c
# Opt level: O0

int f(sunrealtype t,N_Vector y,N_Vector ydot,void *f_data)

{
  int *flag;
  void *f_data_local;
  N_Vector ydot_local;
  N_Vector y_local;
  sunrealtype t_local;
  
  if (*f_data == 1) {
    **(ulong **)((long)ydot->content + 0x10) =
         **(ulong **)((long)y->content + 0x10) ^ 0x8000000000000000;
  }
  else if (*f_data == 2) {
    **(double **)((long)ydot->content + 0x10) = **(double **)((long)y->content + 0x10) * -5.0;
  }
  return 0;
}

Assistant:

static int f(sunrealtype t, N_Vector y, N_Vector ydot, void* f_data)
{
  int* flag;

  flag = (int*)f_data;

  switch (*flag)
  {
  case RHS1: NV_Ith_S(ydot, 0) = -NV_Ith_S(y, 0); break;
  case RHS2: NV_Ith_S(ydot, 0) = -5.0 * NV_Ith_S(y, 0); break;
  }

  return (0);
}